

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  hugeint_t *idata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **states_00;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      idata = (hugeint_t *)input->data;
      states_00 = (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                (idata,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    local_70.data = (data_ptr_t)&input->validity;
    local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_70.sel = (SelectionVector *)aggr_input_data;
    QuantileOperation::
    ConstantOperation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
              (*(QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **)states->data,
               (hugeint_t *)input->data,(AggregateUnaryInput *)&local_70,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  Vector::ToUnifiedFormat(input,count,&local_70);
  Vector::ToUnifiedFormat(states,count,&local_b8);
  UnaryScatterLoop<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
            ((hugeint_t *)local_70.data,aggr_input_data,
             (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **)local_b8.data,
             local_70.sel,local_b8.sel,&local_70.validity,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}